

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O1

void __thiscall timer::canceler::operator()(canceler *this,error_code *e)

{
  long *plVar1;
  
  if (e->_M_value != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"!e",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x70);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    return_code = 1;
  }
  booster::aio::io_service::cancel_timer_event((int)this->srv);
  return;
}

Assistant:

void operator()(booster::system::error_code const &e) const
		{
			TEST(!e);
			srv->cancel_timer_event(event_id);
		}